

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Tan(FParser *this)

{
  bool bVar1;
  double dVar2;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    dVar2 = floatvalue(this->t_argv);
    dVar2 = c_tan(dVar2);
    svalue_t::setDouble(&this->t_return,dVar2);
  }
  return;
}

Assistant:

void FParser::SF_Tan()
{
	if (CheckArgs(1))
	{
		t_return.setDouble(g_tan(floatvalue(t_argv[0])));
	}
}